

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  pointer pFVar1;
  ModuleDesc *pMVar2;
  pointer pFVar3;
  Result RVar4;
  Enum EVar5;
  pointer *__ptr;
  long *local_138;
  pointer local_130;
  string_view local_128;
  string_view local_118;
  Location local_108;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  long *local_c8;
  string local_b8;
  string local_98;
  Var local_78;
  
  local_128.size_ = field_name.size_;
  local_128.data_ = field_name.data_;
  local_118.size_ = module_name.size_;
  local_118.data_ = module_name.data_;
  local_108.field_1.field_0.line = 0;
  local_108.field_1._4_8_ = 0;
  local_108.filename.data_ = (char *)0x0;
  local_108.filename.size_._0_4_ = 0;
  local_108.filename.size_._4_4_ = 0;
  Var::Var(&local_78,sig_index,&local_108);
  RVar4 = SharedValidator::OnFunction
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    pMVar2 = this->module_;
    pFVar3 = (pMVar2->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar1 = pFVar3 + sig_index;
    string_view::to_string_abi_cxx11_(&local_98,&local_118);
    string_view::to_string_abi_cxx11_(&local_b8,&local_128);
    local_130 = pFVar1;
    (**(code **)((long)pFVar3[sig_index].super_ExternType._vptr_ExternType + 0x10))
              (&local_138,pFVar1);
    local_108.filename.data_ = (char *)&local_108.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_c8 = local_138;
    local_138 = (long *)0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar2->imports,(ImportDesc *)&local_108);
    if (local_c8 != (long *)0x0) {
      (**(code **)(*local_c8 + 8))();
    }
    local_c8 = (long *)0x0;
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_108.filename.data_ != &local_108.field_1) {
      operator_delete(local_108.filename.data_);
    }
    if (local_138 != (long *)0x0) {
      (**(code **)(*local_138 + 8))();
    }
    local_138 = (long *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,local_130);
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        string_view module_name,
                                        string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}